

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APFloat.cpp
# Opt level: O0

void __thiscall llvm::detail::DoubleAPFloat::DoubleAPFloat(DoubleAPFloat *this,fltSemantics *S)

{
  undefined8 *puVar1;
  fltSemantics *S_local;
  DoubleAPFloat *this_local;
  
  this->Semantics = S;
  puVar1 = (undefined8 *)operator_new__(0x48);
  *puVar1 = 2;
  APFloat::APFloat((APFloat *)(puVar1 + 1),(fltSemantics *)semIEEEdouble);
  APFloat::APFloat((APFloat *)(puVar1 + 5),(fltSemantics *)semIEEEdouble);
  std::unique_ptr<llvm::APFloat[],std::default_delete<llvm::APFloat[]>>::
  unique_ptr<llvm::APFloat*,std::default_delete<llvm::APFloat[]>,void,bool>
            ((unique_ptr<llvm::APFloat[],std::default_delete<llvm::APFloat[]>> *)&this->Floats,
             (APFloat *)(puVar1 + 1));
  if (this->Semantics == (fltSemantics *)semPPCDoubleDouble) {
    return;
  }
  __assert_fail("Semantics == &semPPCDoubleDouble",
                "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APFloat.cpp"
                ,0xf0c,"llvm::detail::DoubleAPFloat::DoubleAPFloat(const fltSemantics &)");
}

Assistant:

DoubleAPFloat::DoubleAPFloat(const fltSemantics &S)
    : Semantics(&S),
      Floats(new APFloat[2]{APFloat(semIEEEdouble), APFloat(semIEEEdouble)}) {
  assert(Semantics == &semPPCDoubleDouble);
}